

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_reference_expression.cpp
# Opt level: O2

string * __thiscall
duckdb::BoundReferenceExpression::ToString_abi_cxx11_
          (string *__return_storage_ptr__,BoundReferenceExpression *this)

{
  string local_30;
  
  if ((this->super_Expression).super_BaseExpression.alias._M_string_length == 0) {
    ::std::__cxx11::to_string(&local_30,this->index);
    ::std::operator+(__return_storage_ptr__,"#",&local_30);
    ::std::__cxx11::string::~string((string *)&local_30);
  }
  else {
    ::std::__cxx11::string::string
              ((string *)__return_storage_ptr__,
               (string *)&(this->super_Expression).super_BaseExpression.alias);
  }
  return __return_storage_ptr__;
}

Assistant:

string BoundReferenceExpression::ToString() const {
#ifdef DEBUG
	if (DBConfigOptions::debug_print_bindings) {
		return "#" + to_string(index);
	}
#endif
	if (!alias.empty()) {
		return alias;
	}
	return "#" + to_string(index);
}